

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

void __thiscall
jrtplib::RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
~RTPHashTable(RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              *this)

{
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317> *this_local;
  
  ~RTPHashTable(this);
  operator_delete(this,0x10418);
  return;
}

Assistant:

~RTPHashTable()						{ Clear(); }